

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_vtab *psVar4;
  undefined8 uVar5;
  long lVar6;
  long in_FS_OFFSET;
  char cVar7;
  char zBuf [200];
  sqlite3_str local_128;
  char local_108 [208];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.nAlloc = 0xaaaaaaaa;
  local_128.mxAlloc = 0xaaaaaaaa;
  local_128.nChar = 0xaaaaaaaa;
  local_128.accError = 0xaa;
  local_128.printfFlags = 0xaa;
  local_128._30_2_ = 0xaaaa;
  local_128.db = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.zText = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_108,0xaa,200);
  lVar6 = 0;
  local_128.db = (sqlite3 *)0x0;
  local_128.nAlloc = 200;
  local_128.mxAlloc = 0;
  local_128.nChar = 0;
  local_128.accError = '\0';
  local_128.printfFlags = '\0';
  local_128.zText = local_108;
  sqlite3_str_append(&local_128,"CREATE TABLE x",0xe);
  if (*(char *)((long)pAux + 0xb) != '\0') {
    bVar1 = *(byte *)((long)pAux + 10);
    uVar5 = 0x28;
    lVar6 = 0;
    do {
      sqlite3_str_appendf(&local_128,"%c\"%s\"",uVar5,pragCName[lVar6 + (ulong)bVar1]);
      lVar6 = lVar6 + 1;
      uVar5 = 0x2c;
    } while ((uint)lVar6 < (uint)*(byte *)((long)pAux + 0xb));
  }
  if ((int)lVar6 == 0) {
    sqlite3_str_appendf(&local_128,"(\"%s\"",*pAux);
    lVar6 = 1;
  }
  cVar7 = (*(byte *)((long)pAux + 9) & 0x20) != 0;
  if ((bool)cVar7) {
    sqlite3_str_append(&local_128,",arg HIDDEN",0xb);
  }
  if (0x3f < *(byte *)((long)pAux + 9)) {
    sqlite3_str_append(&local_128,",schema HIDDEN",0xe);
    cVar7 = cVar7 + '\x01';
  }
  if (local_128.nChar + 1 < local_128.nAlloc) {
    local_128.zText[local_128.nChar] = ')';
    local_128.nChar = local_128.nChar + 1;
  }
  else {
    enlargeAndAppend(&local_128,")",1);
  }
  sqlite3StrAccumFinish(&local_128);
  iVar2 = sqlite3_declare_vtab(db,local_108);
  if (iVar2 == 0) {
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      psVar4 = (sqlite3_vtab *)sqlite3Malloc(0x30);
    }
    else {
      psVar4 = (sqlite3_vtab *)0x0;
    }
    iVar2 = 0;
    if (psVar4 == (sqlite3_vtab *)0x0) {
      iVar2 = 7;
      psVar4 = (sqlite3_vtab *)0x0;
    }
    else {
      *(undefined8 *)&psVar4[1].nRef = 0;
      psVar4[1].zErrMsg = (char *)0x0;
      psVar4->zErrMsg = (char *)0x0;
      psVar4[1].pModule = (sqlite3_module *)0x0;
      psVar4->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar4->nRef = 0;
      *(void **)&psVar4[1].nRef = pAux;
      psVar4[1].pModule = (sqlite3_module *)db;
      *(char *)((long)&psVar4[1].zErrMsg + 1) = (char)lVar6;
      *(char *)&psVar4[1].zErrMsg = cVar7;
    }
  }
  else {
    pcVar3 = sqlite3_errmsg(db);
    psVar4 = (sqlite3_vtab *)0x0;
    pcVar3 = sqlite3_mprintf("%s",pcVar3);
    *pzErr = pcVar3;
  }
  *ppVtab = psVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}